

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::InvocationInterlockPlacementPass::Process(InvocationInterlockPlacementPass *this)

{
  Module *pMVar1;
  Instruction *pIVar2;
  bool bVar3;
  uint32_t uVar4;
  size_type sVar5;
  size_type sVar6;
  Function *entry_func;
  Status SVar7;
  Module *pMVar8;
  byte bVar9;
  Instruction *entry_inst;
  Instruction **ppIVar10;
  pointer puVar11;
  Function *func;
  _Hashtable<spvtools::opt::Function_*,_std::pair<spvtools::opt::Function_*const,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult>,_std::allocator<std::pair<spvtools::opt::Function_*const,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Function_*>,_std::hash<spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_70;
  unordered_set<spvtools::opt::Function_*,_std::hash<spvtools::opt::Function_*>,_std::equal_to<spvtools::opt::Function_*>,_std::allocator<spvtools::opt::Function_*>_>
  entry_points;
  
  bVar3 = isFragmentShaderInterlockEnabled(this);
  if (bVar3) {
    entry_points._M_h._M_buckets = &entry_points._M_h._M_single_bucket;
    entry_points._M_h._M_bucket_count = 1;
    entry_points._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    entry_points._M_h._M_element_count = 0;
    entry_points._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    entry_points._M_h._M_rehash_policy._M_next_resize = 0;
    entry_points._M_h._M_single_bucket = (__node_base_ptr)0x0;
    pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    ppIVar10 = (Instruction **)
               ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> +
               0x10);
    while (pIVar2 = *ppIVar10,
          pIVar2 != (Instruction *)
                    ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>
                    + 8U)) {
      uVar4 = Instruction::GetSingleWordInOperand(pIVar2,1);
      func = IRContext::GetFunction((this->super_Pass).context_,uVar4);
      std::__detail::
      _Insert<spvtools::opt::Function_*,_spvtools::opt::Function_*,_std::allocator<spvtools::opt::Function_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Function_*>,_std::hash<spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<spvtools::opt::Function_*,_spvtools::opt::Function_*,_std::allocator<spvtools::opt::Function_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Function_*>,_std::hash<spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&entry_points,&func);
      ppIVar10 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    }
    pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    local_70 = &(this->extracted_functions_)._M_h;
    bVar9 = 0;
    pMVar8 = pMVar1;
    for (puVar11 = *(pointer *)
                    &(pMVar1->functions_).
                     super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                     ._M_impl;
        (pMVar1 != pMVar8 ||
        (puVar11 !=
         *(pointer *)
          ((long)&(pMVar8->functions_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                  ._M_impl + 8))); puVar11 = puVar11 + 1) {
      func = *(Function **)
              &(puVar11->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
               ._M_t;
      recordBeginOrEndInFunction(this,func);
      sVar5 = std::
              _Hashtable<spvtools::opt::Function_*,_spvtools::opt::Function_*,_std::allocator<spvtools::opt::Function_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Function_*>,_std::hash<spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&entry_points._M_h,&func);
      if (sVar5 == 0) {
        sVar6 = std::
                _Hashtable<spvtools::opt::Function_*,_std::pair<spvtools::opt::Function_*const,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult>,_std::allocator<std::pair<spvtools::opt::Function_*const,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Function_*>,_std::hash<spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::count(local_70,&func);
        if (sVar6 != 0) {
          bVar3 = removeBeginAndEndInstructionsFromFunction(this,func);
          bVar9 = bVar9 | bVar3;
        }
      }
      pMVar8 = (((this->super_Pass).context_)->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    }
    ppIVar10 = (Instruction **)
               ((long)&(pMVar8->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>.
                       sentinel_ + 8);
    while (pIVar2 = *ppIVar10,
          pIVar2 != &(pMVar8->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>.
                     sentinel_) {
      uVar4 = Instruction::GetSingleWordInOperand(pIVar2,1);
      entry_func = IRContext::GetFunction((this->super_Pass).context_,uVar4);
      uVar4 = Instruction::GetSingleWordInOperand(pIVar2,0);
      if (uVar4 == 4) {
        bVar3 = processFragmentShaderEntry(this,entry_func);
        bVar9 = bVar9 | bVar3;
      }
      ppIVar10 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    }
    SVar7 = bVar9 ^ SuccessWithoutChange;
    std::
    _Hashtable<spvtools::opt::Function_*,_spvtools::opt::Function_*,_std::allocator<spvtools::opt::Function_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Function_*>,_std::hash<spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&entry_points._M_h);
  }
  else {
    SVar7 = SuccessWithoutChange;
  }
  return SVar7;
}

Assistant:

Pass::Status InvocationInterlockPlacementPass::Process() {
  // Skip this pass if the necessary extension or capability is missing
  if (!isFragmentShaderInterlockEnabled()) {
    return Status::SuccessWithoutChange;
  }

  bool modified = false;

  std::unordered_set<Function*> entry_points;
  for (Instruction& entry_inst : context()->module()->entry_points()) {
    uint32_t entry_id =
        entry_inst.GetSingleWordInOperand(kEntryPointFunctionIdInIdx);
    entry_points.insert(context()->GetFunction(entry_id));
  }

  for (auto fi = context()->module()->begin(); fi != context()->module()->end();
       ++fi) {
    Function* func = &*fi;
    recordBeginOrEndInFunction(func);
    if (!entry_points.count(func) && extracted_functions_.count(func)) {
      modified |= removeBeginAndEndInstructionsFromFunction(func);
    }
  }

  for (Instruction& entry_inst : context()->module()->entry_points()) {
    uint32_t entry_id =
        entry_inst.GetSingleWordInOperand(kEntryPointFunctionIdInIdx);
    Function* entry_func = context()->GetFunction(entry_id);

    auto execution_model = spv::ExecutionModel(
        entry_inst.GetSingleWordInOperand(kEntryPointExecutionModelInIdx));

    if (execution_model != spv::ExecutionModel::Fragment) {
      continue;
    }

    modified |= processFragmentShaderEntry(entry_func);
  }

  return modified ? Pass::Status::SuccessWithChange
                  : Pass::Status::SuccessWithoutChange;
}